

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollwrap.c
# Opt level: O1

void pollwrap_get_fd_events_revents(pollwrapper *pw,int fd,int *events_p,int *revents_p)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  pollwrap_fdtopos f2p_find;
  int local_30 [4];
  
  if (-1 < fd) {
    iVar3 = 0;
    local_30[0] = fd;
    pvVar1 = find234(pw->fdtopos,local_30,(cmpfn234)0x0);
    iVar2 = 0;
    if (pvVar1 != (void *)0x0) {
      iVar3 = (int)pw->fds[*(long *)((long)pvVar1 + 8)].events;
      iVar2 = (int)pw->fds[*(long *)((long)pvVar1 + 8)].revents;
    }
    if (events_p != (int *)0x0) {
      *events_p = iVar3;
    }
    if (revents_p != (int *)0x0) {
      *revents_p = iVar2;
    }
    return;
  }
  __assert_fail("fd >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/utils/pollwrap.c"
                ,0x9c,"void pollwrap_get_fd_events_revents(pollwrapper *, int, int *, int *)");
}

Assistant:

static void pollwrap_get_fd_events_revents(pollwrapper *pw, int fd,
                                           int *events_p, int *revents_p)
{
    pollwrap_fdtopos *f2p, f2p_find;
    int events = 0, revents = 0;

    assert(fd >= 0);

    f2p_find.fd = fd;
    f2p = find234(pw->fdtopos, &f2p_find, NULL);
    if (f2p) {
        events = pw->fds[f2p->pos].events;
        revents = pw->fds[f2p->pos].revents;
    }

    if (events_p)
        *events_p = events;
    if (revents_p)
        *revents_p = revents;
}